

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall
kj::_::TransformPromiseNodeBase::get(TransformPromiseNodeBase *this,ExceptionOrValue *output)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  NullableValue<kj::Exception> exception;
  Runnable local_2f0;
  Exception local_2e8;
  Maybe<kj::Exception> local_190;
  
  local_2f0._vptr_Runnable = (_func_int **)&PTR_run_00628f28;
  local_2e8.ownFile.content.ptr = (char *)this;
  local_2e8.ownFile.content.size_ = (size_t)output;
  runCatchingExceptions(&local_190,&local_2f0);
  uVar5 = local_190.ptr.field_1.value.context.ptr.ptr;
  uVar4 = local_190.ptr.field_1.value.description.content.size_;
  uVar3 = local_190.ptr.field_1.value.description.content.ptr;
  uVar2 = local_190.ptr.field_1.value.ownFile.content.size_;
  uVar1 = local_190.ptr.field_1.value.ownFile.content.ptr;
  local_2f0._vptr_Runnable._0_1_ = local_190.ptr.isSet;
  if (local_190.ptr.isSet != false) {
    local_2e8.ownFile.content.ptr = local_190.ptr.field_1.value.ownFile.content.ptr;
    local_2e8.ownFile.content.size_ = local_190.ptr.field_1.value.ownFile.content.size_;
    local_2e8.ownFile.content.disposer = local_190.ptr.field_1.value.ownFile.content.disposer;
    local_190.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_190.ptr.field_1.value.ownFile.content.size_ = 0;
    local_2e8.file = local_190.ptr.field_1.value.file;
    local_2e8.line = local_190.ptr.field_1.value.line;
    local_2e8.type = local_190.ptr.field_1.value.type;
    local_2e8.description.content.ptr = local_190.ptr.field_1.value.description.content.ptr;
    local_2e8.description.content.size_ = local_190.ptr.field_1.value.description.content.size_;
    local_2e8.description.content.disposer =
         local_190.ptr.field_1.value.description.content.disposer;
    local_190.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_190.ptr.field_1.value.description.content.size_ = 0;
    local_2e8.context.ptr.disposer = local_190.ptr.field_1.value.context.ptr.disposer;
    local_2e8.context.ptr.ptr = local_190.ptr.field_1.value.context.ptr.ptr;
    local_190.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    memcpy(local_2e8.trace,(void *)((long)&local_190.ptr.field_1 + 0x50),0x104);
    Exception::~Exception(&local_190.ptr.field_1.value);
    if ((output->exception).ptr.isSet == false) {
      (output->exception).ptr.field_1.value.ownFile.content.ptr = (char *)uVar1;
      (output->exception).ptr.field_1.value.ownFile.content.size_ = uVar2;
      (output->exception).ptr.field_1.value.ownFile.content.disposer =
           local_190.ptr.field_1.value.ownFile.content.disposer;
      local_2e8.ownFile.content.ptr = (char *)0x0;
      local_2e8.ownFile.content.size_ = 0;
      (output->exception).ptr.field_1.value.file = local_2e8.file;
      *(undefined8 *)((long)&(output->exception).ptr.field_1 + 0x20) = local_2e8._32_8_;
      (output->exception).ptr.field_1.value.description.content.ptr = (char *)uVar3;
      (output->exception).ptr.field_1.value.description.content.size_ = uVar4;
      (output->exception).ptr.field_1.value.description.content.disposer =
           local_190.ptr.field_1.value.description.content.disposer;
      local_2e8.description.content.ptr = (char *)0x0;
      local_2e8.description.content.size_ = 0;
      (output->exception).ptr.field_1.value.context.ptr.disposer =
           local_190.ptr.field_1.value.context.ptr.disposer;
      (output->exception).ptr.field_1.value.context.ptr.ptr = (Context *)uVar5;
      local_2e8.context.ptr.ptr = (Context *)0x0;
      memcpy((void *)((long)&(output->exception).ptr.field_1 + 0x50),local_2e8.trace,0x104);
      (output->exception).ptr.isSet = true;
    }
    Exception::~Exception(&local_2e8);
  }
  return;
}

Assistant:

void TransformPromiseNodeBase::get(ExceptionOrValue& output) noexcept {
  KJ_IF_MAYBE(exception, kj::runCatchingExceptions([&]() {
    getImpl(output);
    dropDependency();
  })) {
    output.addException(kj::mv(*exception));
  }
}